

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)

{
  pthread_mutex_t *__mutex;
  RegisterQueue __ptr;
  _ReaderRegisterMsg *p_Var1;
  undefined8 *puVar2;
  ssize_t *psVar3;
  int iVar4;
  WS_ReaderInfo reader;
  uint *puVar5;
  CP_PeerConnection *pCVar6;
  attr_list p_Var7;
  DP_WSR_Stream pvVar8;
  ulong uVar9;
  undefined8 uVar10;
  CMConnection p_Var11;
  WS_ReaderInfo *pp_Var12;
  void **__ptr_00;
  WS_ReaderInfo p_Var13;
  SstStream p_Var14;
  ulong uVar15;
  int iVar16;
  long *plVar17;
  long lVar18;
  CMConnection *pp_Var19;
  uint uVar20;
  CPTimestepList p_Var21;
  long lVar22;
  ssize_t Ret;
  ssize_t sVar23;
  int local_cc;
  CMConnection local_c0;
  void *free_block;
  int local_ac;
  undefined8 local_a8;
  SstParams p_Stack_a0;
  void **local_98;
  WS_ReaderInfo p_Stack_90;
  void *local_88;
  void *ret_data_block;
  void *DP_WriterInfo;
  ssize_t GlobalStartingTimestep;
  int GlobalSuccess;
  int MySuccess;
  _CP_DP_PairInfo combined_init;
  char *local_48;
  WS_ReaderInfo local_40;
  long local_38;
  
  free_block = (void *)0x0;
  reader = (WS_ReaderInfo)malloc(0x90);
  CP_verbose(Stream,PerRankVerbose,"Beginning writer-side reader open protocol\n");
  if (Stream->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
    __ptr = Stream->ReaderRegisterQueue;
    Stream->ReaderRegisterQueue = __ptr->Next;
    __ptr->Next = (_RegisterQueue *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
    p_Var1 = __ptr->Msg;
    local_a8 = (int *)(ulong)(uint)p_Var1->ReaderCohortSize;
    p_Stack_a0 = (SstParams)p_Var1->CP_ReaderInfo;
    local_98 = p_Var1->DP_ReaderInfo;
    local_88 = (void *)(ulong)p_Var1->SpecPreload;
    p_Stack_90 = reader;
    puVar5 = (uint *)CP_distributeDataFromRankZero
                               (Stream,&local_a8,Stream->CPInfo->CombinedReaderInfoFormat,
                                &free_block);
    local_c0 = __ptr->Conn;
    local_cc = __ptr->Msg->WriterResponseCondition;
    CMreturn_buffer(Stream->CPInfo->SharedCM->cm);
    free(__ptr);
  }
  else {
    local_cc = -1;
    local_c0 = (CMConnection)0x0;
    puVar5 = (uint *)CP_distributeDataFromRankZero
                               (Stream,(void *)0x0,Stream->CPInfo->CombinedReaderInfoFormat,
                                &free_block);
  }
  uVar20 = *puVar5;
  pCVar6 = (CP_PeerConnection *)calloc(0x18,(long)(int)uVar20);
  pp_Var19 = &pCVar6->CMconn;
  for (lVar22 = 0; lVar22 < (int)uVar20; lVar22 = lVar22 + 1) {
    p_Var7 = (attr_list)attr_list_from_string(**(undefined8 **)(*(long *)(puVar5 + 2) + lVar22 * 8))
    ;
    ((CP_PeerConnection *)(pp_Var19 + -2))->ContactList = p_Var7;
    pp_Var19[-1] = (CMConnection)*(void **)(*(long *)(*(long *)(puVar5 + 2) + lVar22 * 8) + 8);
    if ((lVar22 == 0) && (local_c0 != (CMConnection)0x0)) {
      CMConnection_add_reference(local_c0);
      *pp_Var19 = local_c0;
      CMconn_register_close_handler(local_c0,WriterConnCloseHandler,reader);
    }
    else {
      *pp_Var19 = (CMConnection)0x0;
    }
    uVar20 = *puVar5;
    pp_Var19 = pp_Var19 + 3;
  }
  pvVar8 = (*Stream->DP_Interface->initWriterPerReader)
                     (&Svcs,Stream->DP_Stream,uVar20,pCVar6,*(void ***)(puVar5 + 4),&DP_WriterInfo);
  memset(reader,0,0x90);
  reader->RankZeroID = *(void **)(puVar5 + 6);
  reader->DP_WSR_Stream = pvVar8;
  reader->ParentStream = Stream;
  reader->LastReleasedTimestep = -1;
  reader->Connections = pCVar6;
  reader->FullCommPatternLocked = 0;
  reader->CommPatternLockTimestep = -1;
  reader->ReaderStatus = Opening;
  p_Var14 = Stream;
  if (puVar5[8] == 1) {
    reader->PreloadMode = SstPreloadSpeculative;
    CP_verbose(Stream,PerStepVerbose,"Setting SpeculativePreload ON for new reader\n");
    p_Var14 = reader->ParentStream;
    pCVar6 = reader->Connections;
  }
  uVar20 = *puVar5;
  plVar17 = *(long **)(puVar5 + 2);
  iVar4 = p_Var14->Rank;
  local_ac = p_Var14->CohortSize;
  reader->ReaderCohortSize = uVar20;
  if (pCVar6 == (CP_PeerConnection *)0x0) {
    pCVar6 = (CP_PeerConnection *)calloc(0x18,(long)(int)uVar20);
    reader->Connections = pCVar6;
  }
  lVar22 = 0;
  uVar9 = 0;
  if (0 < (int)uVar20) {
    uVar9 = (ulong)uVar20;
  }
  for (; uVar9 * 0x18 - lVar22 != 0; lVar22 = lVar22 + 0x18) {
    if (*(long *)((long)&pCVar6->ContactList + lVar22) == 0) {
      uVar10 = attr_list_from_string(*(undefined8 *)*plVar17);
      pCVar6 = reader->Connections;
      *(undefined8 *)((long)&pCVar6->ContactList + lVar22) = uVar10;
    }
    *(undefined8 *)((long)&pCVar6->RemoteStreamID + lVar22) = *(undefined8 *)(*plVar17 + 8);
    plVar17 = plVar17 + 1;
  }
  if (p_Var14->ConfigParams->CPCommPattern == 1) {
    getPeerArrays(local_ac,iVar4,uVar20,&reader->Peers,(int **)&local_a8);
    lVar22 = 0;
    while( true ) {
      uVar20 = *(uint *)((long)local_a8 + lVar22);
      lVar18 = (long)(int)uVar20;
      if (lVar18 == -1) break;
      iVar16 = reader->ParentStream->ConnectionUsleepMultiplier;
      if (iVar16 != 0) {
        usleep(iVar16 * iVar4);
      }
      p_Var11 = reader->Connections[lVar18].CMconn;
      if (p_Var11 == (CMConnection)0x0) {
        p_Var11 = Tunneling_get_conn(reader->ParentStream->CPInfo->SharedCM->cm,
                                     reader->Connections[lVar18].ContactList);
        reader->Connections[lVar18].CMconn = p_Var11;
        if (p_Var11 == (CMConnection)0x0) goto LAB_006bdc2e;
      }
      CP_verbose(p_Var14,TraceVerbose,"Registering a close handler for connection %p, to peer %d\n",
                 p_Var11,(ulong)uVar20);
      CMconn_register_close_handler
                (reader->Connections[lVar18].CMconn,WriterConnCloseHandler,reader);
      CP_verbose(reader->ParentStream,TraceVerbose,"Sending peer setup to rank %d\n",(ulong)uVar20);
      iVar16 = -1;
      if (lVar22 == 0) {
        iVar16 = reader->ParentStream->Rank;
      }
      SendPeerSetupMsg(reader,uVar20,iVar16);
      lVar22 = lVar22 + 4;
    }
    free(local_a8);
    lVar22 = 0;
    while( true ) {
      uVar20 = *(uint *)((long)reader->Peers + lVar22);
      lVar18 = (long)(int)uVar20;
      if (lVar18 == -1) break;
      pCVar6 = reader->Connections;
      if (pCVar6[lVar18].CMconn == (CMConnection)0x0) {
        p_Var14 = reader->ParentStream;
        if (p_Var14->ConnectionUsleepMultiplier != 0) {
          usleep(p_Var14->ConnectionUsleepMultiplier * iVar4);
          p_Var14 = reader->ParentStream;
          pCVar6 = reader->Connections;
        }
        p_Var11 = Tunneling_get_conn(p_Var14->CPInfo->SharedCM->cm,pCVar6[lVar18].ContactList);
        reader->Connections[lVar18].CMconn = p_Var11;
        if (p_Var11 == (CMConnection)0x0) goto LAB_006bdc2e;
        CMconn_register_close_handler(p_Var11,WriterConnCloseHandler,reader);
        CP_verbose(reader->ParentStream,TraceVerbose,"Sending peer setup to rank %d\n",(ulong)uVar20
                  );
        SendPeerSetupMsg(reader,uVar20,reader->ParentStream->Rank);
      }
      lVar22 = lVar22 + 4;
    }
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    if (p_Var14->Rank == 0) {
      p_Var11 = pCVar6->CMconn;
      if (p_Var11 == (CMConnection)0x0) {
        p_Var11 = Tunneling_get_conn(reader->ParentStream->CPInfo->SharedCM->cm,pCVar6->ContactList)
        ;
        reader->Connections->CMconn = p_Var11;
        if (p_Var11 == (CMConnection)0x0) {
          iVar4 = 0;
          CP_error(reader->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n")
          ;
          p_Var14 = reader->ParentStream;
          uVar10 = attr_list_to_string(reader->Connections->ContactList);
          CP_error(p_Var14,"%s\n",uVar10);
          goto LAB_006bdc6d;
        }
      }
      CMconn_register_close_handler(p_Var11,WriterConnCloseHandler,reader);
    }
  }
LAB_006bdc6d:
  GlobalSuccess = 0;
  MySuccess = iVar4;
  SMPI_Allreduce(&MySuccess,&GlobalSuccess,1,SMPI_INT,SMPI_LAND,Stream->mpiComm);
  if (GlobalSuccess == 0) {
    reader = (WS_ReaderInfo)0x0;
  }
  else {
    AddToLastCallFreeList(reader);
    free(free_block);
    __mutex = &Stream->DataLock;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    pp_Var12 = (WS_ReaderInfo *)realloc(Stream->Readers,(long)Stream->ReaderCount * 8 + 8);
    Stream->Readers = pp_Var12;
    iVar4 = Stream->ReaderCount;
    pp_Var12[iVar4] = reader;
    Stream->ReaderCount = iVar4 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_48 = CP_GetContactString(Stream,(attr_list)0x0);
    combined_init.CP_Info = &local_48;
    combined_init.DP_Info = (void **)DP_WriterInfo;
    sVar23 = Stream->WriterTimestep;
    p_Var21 = Stream->QueuedTimesteps;
    local_40 = reader;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    while (p_Var21 != (CPTimestepList)0x0) {
      CP_verbose(Stream,TraceVerbose,
                 "Earliest available : Writer-side Timestep %ld now has reference count %d, expired %d, precious %d\n"
                 ,p_Var21->Timestep,(ulong)(uint)p_Var21->ReferenceCount,
                 (ulong)(uint)p_Var21->Expired,p_Var21->PreciousTimestep);
      psVar3 = &p_Var21->Timestep;
      p_Var21 = p_Var21->Next;
      if (*psVar3 < sVar23) {
        sVar23 = *psVar3;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    uVar9 = 0;
    local_38 = 0;
    if (sVar23 != -1) {
      local_38 = sVar23;
    }
    SMPI_Allreduce(&local_38,&GlobalStartingTimestep,1,SMPI_LONG,SMPI_MAX,Stream->mpiComm);
    CP_verbose(Stream,TraceVerbose,"My oldest timestep was %zd, global oldest timestep was %zd\n",
               local_38,GlobalStartingTimestep);
    reader->StartingTimestep = GlobalStartingTimestep;
    __ptr_00 = CP_consolidateDataToRankZero
                         (Stream,&combined_init,Stream->CPInfo->PerRankWriterInfoFormat,
                          &ret_data_block);
    if (Stream->Rank == 0) {
      uVar20 = Stream->CohortSize;
      local_a8 = (int *)CONCAT44(uVar20,local_cc);
      p_Stack_a0 = Stream->ConfigParams;
      local_98 = (void **)GlobalStartingTimestep;
      p_Var13 = (WS_ReaderInfo)malloc((long)(int)uVar20 << 3);
      p_Stack_90 = p_Var13;
      local_88 = malloc((long)(int)uVar20 << 3);
      uVar15 = 0;
      if (0 < (int)uVar20) {
        uVar15 = (ulong)uVar20;
      }
      for (; uVar15 != uVar9; uVar9 = uVar9 + 1) {
        puVar2 = (undefined8 *)__ptr_00[uVar9];
        (&p_Var13->ParentStream)[uVar9] = (SstStream)*puVar2;
        *(undefined8 *)((long)local_88 + uVar9 * 8) = puVar2[1];
      }
      iVar4 = CMwrite(local_c0,Stream->CPInfo->SharedCM->WriterResponseFormat,&local_a8);
      if (iVar4 != 1) {
        CP_verbose(Stream,CriticalVerbose,
                   "Message failed to send to reader in participate in reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n"
                  );
      }
      free(p_Stack_90);
      free(local_88);
    }
    free(local_48);
    free(ret_data_block);
    free(__ptr_00);
    CP_verbose(Stream,PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, reader ready response pending\n"
               ,reader);
  }
  return reader;
LAB_006bdc2e:
  iVar4 = 0;
  CP_error(reader->ParentStream,"Connection failed in SstInitWSReader! Contact list was:\n");
  p_Var14 = reader->ParentStream;
  uVar10 = attr_list_to_string(reader->Connections[lVar18].ContactList);
  CP_error(p_Var14,"%s\n",uVar10);
  goto LAB_006bdc6d;
}

Assistant:

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)
{
    RegisterQueue Req;
    reader_data_t ReturnData;
    void *free_block = NULL;
    int WriterResponseCondition = -1;
    CMConnection conn = NULL;
    ssize_t MyStartingTimestep, GlobalStartingTimestep;
    WS_ReaderInfo CP_WSR_Stream = malloc(sizeof(*CP_WSR_Stream));

    CP_verbose(Stream, PerRankVerbose, "Beginning writer-side reader open protocol\n");
    if (Stream->Rank == 0)
    {
        STREAM_MUTEX_LOCK(Stream);
        assert((Stream->ReaderRegisterQueue));
        Req = Stream->ReaderRegisterQueue;
        Stream->ReaderRegisterQueue = Req->Next;
        Req->Next = NULL;
        STREAM_MUTEX_UNLOCK(Stream);
        struct _CombinedReaderInfo reader_data;
        memset(&reader_data, 0, sizeof(reader_data));
        reader_data.ReaderCohortSize = Req->Msg->ReaderCohortSize;
        reader_data.CP_ReaderInfo = Req->Msg->CP_ReaderInfo;
        reader_data.DP_ReaderInfo = Req->Msg->DP_ReaderInfo;
        reader_data.RankZeroID = CP_WSR_Stream;
        reader_data.SpecPreload = Req->Msg->SpecPreload;
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &reader_data, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
        WriterResponseCondition = Req->Msg->WriterResponseCondition;
        conn = Req->Conn;
        CMreturn_buffer(Stream->CPInfo->SharedCM->cm, Req->Msg);
        free(Req);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
    }
    //    printf("I am writer rank %d, my info on readers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_reader_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    DP_WSR_Stream per_reader_Stream;
    void *DP_WriterInfo;
    void *ret_data_block;
    CP_PeerConnection *connections_to_reader;
    connections_to_reader = calloc(sizeof(CP_PeerConnection), ReturnData->ReaderCohortSize);
    for (int i = 0; i < ReturnData->ReaderCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_ReaderInfo[i]->ContactInfo);
        connections_to_reader[i].ContactList = attrs;
        connections_to_reader[i].RemoteStreamID = ReturnData->CP_ReaderInfo[i]->ReaderID;
        if ((i == 0) && (conn != NULL))
        {
            // reuse existing connection to reader rank 0
            // (only not NULL if this is writer rank 0)
            CMConnection_add_reference(conn);
            connections_to_reader[i].CMconn = conn;
            CMconn_register_close_handler(conn, WriterConnCloseHandler, (void *)CP_WSR_Stream);
        }
        else
        {
            connections_to_reader[i].CMconn = NULL;
        }
    }

    per_reader_Stream = Stream->DP_Interface->initWriterPerReader(
        &Svcs, Stream->DP_Stream, ReturnData->ReaderCohortSize, connections_to_reader,
        ReturnData->DP_ReaderInfo, &DP_WriterInfo);

    memset(CP_WSR_Stream, 0, sizeof(*CP_WSR_Stream));
    CP_WSR_Stream->ReaderStatus = NotOpen;
    CP_WSR_Stream->RankZeroID = ReturnData->RankZeroID;

    CP_WSR_Stream->DP_WSR_Stream = per_reader_Stream;
    CP_WSR_Stream->ParentStream = Stream;
    CP_WSR_Stream->LastReleasedTimestep = -1;
    CP_WSR_Stream->Connections = connections_to_reader;
    CP_WSR_Stream->LocalReaderDefinitionsLocked = 0;
    CP_WSR_Stream->FullCommPatternLocked = 0;
    CP_WSR_Stream->CommPatternLockTimestep = -1;
    CP_WSR_Stream->ReaderStatus = Opening;
    if (ReturnData->SpecPreload == SpecPreloadOn)
    {

        CP_WSR_Stream->PreloadMode = SstPreloadSpeculative;
        CP_WSR_Stream->PreloadModeActiveTimestep = 0;
        CP_verbose(Stream, PerStepVerbose, "Setting SpeculativePreload ON for new reader\n");
    }

    int MySuccess =
        initWSReader(CP_WSR_Stream, ReturnData->ReaderCohortSize, ReturnData->CP_ReaderInfo);

    int GlobalSuccess = 0;
    SMPI_Allreduce(&MySuccess, &GlobalSuccess, 1, SMPI_INT, SMPI_LAND, Stream->mpiComm);

    if (!GlobalSuccess)
    {
        return NULL;
    }
    AddToLastCallFreeList(CP_WSR_Stream);
    free(free_block);
    ReturnData = NULL; /* now invalid */

    STREAM_MUTEX_LOCK(Stream);
    Stream->Readers =
        realloc(Stream->Readers, sizeof(Stream->Readers[0]) * (Stream->ReaderCount + 1));
    Stream->Readers[Stream->ReaderCount] = CP_WSR_Stream;
    Stream->ReaderCount++;
    STREAM_MUTEX_UNLOCK(Stream);

    struct _CP_DP_PairInfo combined_init;
    struct _CP_WriterInitInfo cpInfo;

    struct _CP_DP_PairInfo **pointers = NULL;

    memset(&cpInfo, 0, sizeof(cpInfo));
    cpInfo.ContactInfo = CP_GetContactString(Stream, NULL);
    cpInfo.WriterID = CP_WSR_Stream;

    combined_init.CP_Info = (void **)&cpInfo;
    combined_init.DP_Info = DP_WriterInfo;

    MyStartingTimestep = earliestAvailableTimestepNumber(Stream, Stream->WriterTimestep);
    if (MyStartingTimestep == -1)
        MyStartingTimestep = 0;

    SMPI_Allreduce(&MyStartingTimestep, &GlobalStartingTimestep, 1, SMPI_LONG, SMPI_MAX,
                   Stream->mpiComm);

    CP_verbose(Stream, TraceVerbose, "My oldest timestep was %zd, global oldest timestep was %zd\n",
               MyStartingTimestep, GlobalStartingTimestep);

    CP_WSR_Stream->StartingTimestep = GlobalStartingTimestep;

    pointers = (struct _CP_DP_PairInfo **)CP_consolidateDataToRankZero(
        Stream, &combined_init, Stream->CPInfo->PerRankWriterInfoFormat, &ret_data_block);

    if (Stream->Rank == 0)
    {
        struct _WriterResponseMsg response;
        memset(&response, 0, sizeof(response));
        response.WriterResponseCondition = WriterResponseCondition;
        response.WriterCohortSize = Stream->CohortSize;
        response.WriterConfigParams = Stream->ConfigParams;
        response.NextStepNumber = GlobalStartingTimestep;
        response.CP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        response.DP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        for (int i = 0; i < response.WriterCohortSize; i++)
        {
            response.CP_WriterInfo[i] = (struct _CP_WriterInitInfo *)pointers[i]->CP_Info;
            response.DP_WriterInfo[i] = pointers[i]->DP_Info;
        }
        STREAM_ASSERT_UNLOCKED(Stream);
        if (CMwrite(conn, Stream->CPInfo->SharedCM->WriterResponseFormat, &response) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to reader in participate in "
                       "reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
        }
        free(response.CP_WriterInfo);
        free(response.DP_WriterInfo);
    }
    free(cpInfo.ContactInfo);
    if (ret_data_block)
        free(ret_data_block);
    if (pointers)
        free(pointers);
    CP_verbose(Stream, PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, "
               "reader ready response pending\n",
               CP_WSR_Stream);
    return CP_WSR_Stream;
}